

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int uint64_log2(uint64_t x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int a5;
  int a4;
  int a3;
  int a2;
  int a1;
  int a0;
  uint64_t x_local;
  
  if (x == 0) {
    x_local._4_4_ = -0x80000000;
  }
  else {
    iVar1 = 0;
    if (0xffffffff < x) {
      iVar1 = 0x20;
    }
    uVar6 = x >> (sbyte)iVar1;
    iVar2 = 0;
    if (0xffff < uVar6) {
      iVar2 = 0x10;
    }
    uVar6 = uVar6 >> (sbyte)iVar2;
    iVar3 = 0;
    if (0xff < uVar6) {
      iVar3 = 8;
    }
    uVar6 = uVar6 >> (sbyte)iVar3;
    iVar4 = 0;
    if (0xf < uVar6) {
      iVar4 = 4;
    }
    uVar6 = uVar6 >> (sbyte)iVar4;
    iVar5 = 0;
    if (3 < uVar6) {
      iVar5 = 2;
    }
    x_local._4_4_ = (uint)(1 < uVar6 >> (sbyte)iVar5) + iVar5 + iVar4 + iVar3 + iVar2 + iVar1;
  }
  return x_local._4_4_;
}

Assistant:

int uint64_log2( uint64_t x )
{
    int a0, a1, a2, a3, a4, a5;
    if (x == 0) return INT_MIN;
    a5 = (x > 0xffffffff)?32:0;
    x >>= a5;
    a4 = (x > 0xffff)?16:0;
    x >>= a4;
    a3 = (x > 0xff)?8:0;
    x >>= a3;
    a2 = (x > 0xf)?4:0;
    x >>= a2;
    a1 = (x > 0x3)?2:0;
    x >>= a1;
    a0 = (x > 0x1)?1:0;
    return a0 + a1 + a2 + a3 + a4 + a5;
}